

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticCube>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticCube> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016d74f8;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016d7150,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016d6e50;
  pzgeom::TPZQuadraticCube::TPZQuadraticCube(&this->fGeo,nodeindices);
  lVar1 = 0xf8;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x58) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x380);
  for (lVar1 = 0xf8; lVar1 != 0x380; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}